

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Meteomatics_Internals.h
# Opt level: O2

bool __thiscall
MeteomaticsApiClient::getMultiPointTimeSeries
          (MeteomaticsApiClient *this,string *startTime,string *stopTime,string *timeStep,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,vector<double,_std::allocator<double>_> *lats,
          vector<double,_std::allocator<double>_> *lons,
          vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
          *result,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *times,string *msg,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *optionals)

{
  uint uVar1;
  HttpClient *this_00;
  MeteomaticsApiClient *this_01;
  int iVar2;
  ostream *poVar3;
  string *lons_00;
  int httpReturnCode;
  string queryString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  MeteomaticsApiClient *local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  string local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lons_00 = timeStep;
  local_1b8 = this;
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::clear(result);
  msg->_M_string_length = 0;
  *(msg->_M_dataplus)._M_p = '\0';
  std::operator+(&local_50,"/",startTime);
  std::operator+(&local_110,&local_50,"--");
  std::operator+(&local_f0,&local_110,stopTime);
  std::operator+(&local_d0,&local_f0,":P");
  std::operator+(&local_b0,&local_d0,timeStep);
  std::operator+(&local_90,&local_b0,"/");
  createParameterListString(&local_130,parameters);
  std::operator+(&local_190,&local_90,&local_130);
  std::operator+(&local_1b0,&local_190,"/");
  createLatLonListString_abi_cxx11_
            (&local_150,(MeteomaticsApiClient *)lats,lons,
             (vector<double,_std::allocator<double>_> *)lons_00);
  std::operator+(&local_1f8,&local_1b0,&local_150);
  std::operator+(&local_1d8,&local_1f8,"/bin");
  getOptionalSelectString(&local_170,optionals);
  std::operator+(&local_70,&local_1d8,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_50);
  local_1b0._M_dataplus._M_p._0_4_ = 0;
  MMIntern::MemoryClass::MemoryClass((MemoryClass *)&local_1d8,500);
  this_01 = local_1b8;
  this_00 = local_1b8->httpClient;
  std::__cxx11::string::string((string *)&local_1f8,"api.meteomatics.com",(allocator *)&local_190);
  MMIntern::HttpClient::requestBinary
            (this_00,&local_1f8,&local_70,(MemoryClass *)&local_1d8,this_01->dataRequestTimeout,
             (int *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1f8);
  iVar2 = (int)local_1b0._M_dataplus._M_p;
  uVar1 = (int)local_1b0._M_dataplus._M_p - 200;
  if (uVar1 < 200) {
    if ((long)(lats->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(lats->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start == 8) {
      local_1f8._M_dataplus._M_p = (pointer)0x0;
      local_1f8._M_string_length = 0;
      local_1f8.field_2._M_allocated_capacity = 0;
      readSinglePointTimeSeriesBin(this_01,(MemoryClass *)&local_1d8,(Matrix *)&local_1f8,times);
      std::
      vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
      ::push_back(result,(value_type *)&local_1f8);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)&local_1f8);
    }
    else {
      readMultiPointTimeSeriesBin(this_01,(MemoryClass *)&local_1d8,result,times);
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Http Error! Code: ");
    std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<((ostream *)&std::cout,". For more information see returned msg string!"
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
    MMIntern::MemoryClass::readString_abi_cxx11_
              (&local_1f8,(MemoryClass *)&local_1d8,
               local_1d8._M_string_length - (long)local_1d8._M_dataplus._M_p);
    std::__cxx11::string::operator=((string *)msg,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_70);
  return uVar1 < 200;
}

Assistant:

bool MeteomaticsApiClient::getMultiPointTimeSeries(const std::string& startTime, const std::string& stopTime, const std::string& timeStep, const std::vector<std::string>& parameters, std::vector<double> lats, std::vector<double> lons, std::vector<Matrix>& result, std::vector<std::string>& times, std::string& msg, const std::vector<std::string>& optionals) const
{
    result.clear();
    msg.clear();
    
    std::string queryString = "/" + startTime + "--" + stopTime + ":P" + timeStep
    + "/" + createParameterListString(parameters)
    + "/" + createLatLonListString(lats, lons)
    + "/bin"
    + getOptionalSelectString(optionals);
    
    int httpReturnCode = 0;
    
    MMIntern::MemoryClass mem(500);
    
    httpClient->requestBinary("api.meteomatics.com", queryString, mem, dataRequestTimeout, httpReturnCode);
    
    if (!MMIntern::http_code_success(httpReturnCode))
    {
        std::cout << "Http Error! Code: " << httpReturnCode;
        std::cout << ". For more information see returned msg string!" << std::endl;
        msg = mem.readString(mem.size());
        return false;
    }
    
    if (lats.size() == 1)
    {
        Matrix tmpM;
        if (!readSinglePointTimeSeriesBin(mem, tmpM, times))
        {
            std::cout << "Error while reading mem-object." << std::endl;
            return false;
        }
        result.push_back(tmpM);
    }
    else
    {
        if (!readMultiPointTimeSeriesBin(mem, result, times))
        {
            std::cout << "Error while reading mem-object." << std::endl;
            return false;
        }
    }
    return true;
}